

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

void __thiscall minihttp::HttpSocket::_FinishRequest(HttpSocket *this)

{
  uint uVar1;
  int in_ESI;
  
  if (this->_inProgress == true) {
    uVar1 = this->_status - 0x12d;
    if (((7 < uVar1) || ((199U >> (uVar1 & 0x1f) & 1) == 0)) || (this->_alwaysHandle == true)) {
      (*(this->super_TcpSocket)._vptr_TcpSocket[9])(this);
    }
    this->_inProgress = false;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&(this->_hdrs)._M_t);
    if (this->_mustClose == true) {
      TcpSocket::close(&this->super_TcpSocket,in_ESI);
      return;
    }
  }
  return;
}

Assistant:

void HttpSocket::_FinishRequest(void)
{
    traceprint("HttpSocket::_FinishRequest\n");
    if(_inProgress)
    {
        traceprint("... in progress. redirecting = %d\n", IsRedirecting());
        if(!IsRedirecting() || _alwaysHandle)
            _OnRequestDone(); // notify about finished request
        _inProgress = false;
        _hdrs.clear();
        if(_mustClose)
            close();
    }
}